

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O0

int Kit_SopBestLiteral(Kit_Sop_t *cSop,int nLits,uint uMask)

{
  int iVar1;
  bool bVar2;
  int local_38;
  int fUseFirst;
  int nLitsCur;
  int nLitsMax;
  int iMax;
  int k;
  int i;
  uint uCube;
  uint uMask_local;
  int nLits_local;
  Kit_Sop_t *cSop_local;
  
  nLitsCur = -1;
  fUseFirst = -1;
  for (iMax = 0; iMax < nLits; iMax = iMax + 1) {
    iVar1 = Kit_CubeHasLit(uMask,iMax);
    if (iVar1 != 0) {
      local_38 = 0;
      nLitsMax = 0;
      while( true ) {
        iVar1 = Kit_SopCubeNum(cSop);
        bVar2 = false;
        if (nLitsMax < iVar1) {
          k = Kit_SopCube(cSop,nLitsMax);
          bVar2 = k != 0;
        }
        if (!bVar2) break;
        iVar1 = Kit_CubeHasLit(k,iMax);
        if (iVar1 != 0) {
          local_38 = local_38 + 1;
        }
        nLitsMax = nLitsMax + 1;
      }
      if ((1 < local_38) && (fUseFirst < local_38)) {
        fUseFirst = local_38;
        nLitsCur = iMax;
      }
    }
  }
  if (fUseFirst < 0) {
    cSop_local._4_4_ = -1;
  }
  else {
    cSop_local._4_4_ = nLitsCur;
  }
  return cSop_local._4_4_;
}

Assistant:

int Kit_SopBestLiteral( Kit_Sop_t * cSop, int nLits, unsigned uMask )
{
    unsigned uCube;
    int i, k, iMax, nLitsMax, nLitsCur;
    int fUseFirst = 1;

    // go through each literal
    iMax = -1;
    nLitsMax = -1;
    for ( i = 0; i < nLits; i++ )
    {
        if ( !Kit_CubeHasLit(uMask, i) )
            continue;
        // go through all the cubes
        nLitsCur = 0;
        Kit_SopForEachCube( cSop, uCube, k )
            if ( Kit_CubeHasLit(uCube, i) )
                nLitsCur++;
        // skip the literal that does not occur or occurs once
        if ( nLitsCur < 2 )
            continue;
        // check if this is the best literal
        if ( fUseFirst )
        {
            if ( nLitsMax < nLitsCur )
            {
                nLitsMax = nLitsCur;
                iMax = i;
            }
        }
        else
        {
            if ( nLitsMax <= nLitsCur )
            {
                nLitsMax = nLitsCur;
                iMax = i;
            }
        }
    }
    if ( nLitsMax >= 0 )
        return iMax;
    return -1;
}